

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O1

void __thiscall
QPlainTestLogger::printBenchmarkResults(QPlainTestLogger *this,QList<QBenchmarkResult> *results)

{
  array<char,_1024UL> *msg;
  QBenchmarkResult *pQVar1;
  double dVar2;
  QBenchmarkMetric QVar3;
  int *piVar4;
  QBenchmarkResult *pQVar5;
  int iVar6;
  char *pcVar7;
  undefined1 *puVar8;
  long lVar9;
  char *pcVar10;
  QBenchmarkResult *pQVar11;
  long lVar12;
  int iVar13;
  const_iterator __begin1;
  QBenchmarkResult *pQVar14;
  long lVar15;
  QBenchmarkResult *pQVar16;
  char *pcVar17;
  long in_FS_OFFSET;
  bool bVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  qreal qVar22;
  const_iterator __end2;
  QList<QBenchmarkResult> *__range2;
  FixedBufString<1022> buf;
  double local_478;
  QByteArray local_458;
  FixedBufString<1022> local_440;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_440,0xaa,0x408);
  local_440.used = 0;
  local_440.buf._M_elems[0] = '\0';
  pQVar14 = (results->d).ptr;
  lVar12 = (results->d).size;
  lVar9 = lVar12 * 0x50;
  bVar18 = lVar12 != 0;
  bVar19 = bVar18;
  if (bVar18) {
    QVar3 = (pQVar14->measurement).metric;
    pQVar1 = pQVar14;
    lVar15 = lVar9;
    while (QVar3 != WalltimeNanoseconds) {
      lVar15 = lVar15 + -0x50;
      bVar19 = lVar15 != 0;
      if (lVar15 == 0) goto LAB_00120fd4;
      QVar3 = pQVar1[1].measurement.metric;
      pQVar1 = pQVar1 + 1;
    }
    local_478 = (pQVar1->measurement).value;
  }
LAB_00120fd4:
  if (bVar19) {
    dVar20 = local_478 / 1000000000.0;
  }
  else {
    if (lVar12 != 0) {
      QVar3 = (pQVar14->measurement).metric;
      pQVar1 = pQVar14;
      while (QVar3 != WalltimeMilliseconds) {
        lVar9 = lVar9 + -0x50;
        bVar18 = lVar9 != 0;
        if (lVar9 == 0) goto LAB_00121029;
        QVar3 = pQVar1[1].measurement.metric;
        pQVar1 = pQVar1 + 1;
      }
      local_478 = (pQVar1->measurement).value;
    }
LAB_00121029:
    if (bVar18) {
      dVar20 = local_478 / 1000.0;
    }
    else {
      dVar20 = 0.0;
    }
  }
  if (lVar12 != 0) {
    msg = &local_440.buf;
    pQVar1 = pQVar14 + lVar12;
    do {
      local_440.used = 0;
      local_440.buf._M_elems[0] = '\0';
      pcVar7 = QTest::benchmarkMetricUnit((pQVar14->measurement).metric);
      dVar2 = (pQVar14->measurement).value;
      iVar13 = 0;
      if ((0.0 < dVar2) && (1.0 <= dVar2)) {
        iVar13 = 0;
        dVar21 = 1.0;
        do {
          dVar21 = dVar21 * 10.0;
          iVar13 = iVar13 + 1;
        } while (1.0 <= dVar2 / dVar21);
      }
      qVar22 = (qreal)pQVar14->iterations;
      QTest::formatResult<double>(&local_458,dVar2 / qVar22,iVar13);
      pcVar10 = local_458.d.ptr;
      if (local_458.d.ptr == (char *)0x0) {
        pcVar10 = (char *)&QByteArray::_empty;
      }
      pcVar17 = "";
      if (pQVar14->setByMacro != false) {
        pcVar17 = " per iteration";
      }
      iVar6 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,"     %s %s%s",pcVar10,
                       pcVar7,pcVar17);
      local_440.used = local_440.used + (long)iVar6;
      piVar4 = (int *)CONCAT62(local_458.d.d._2_6_,CONCAT11(local_458.d.d._1_1_,local_458.d.d._0_1_)
                              );
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)
                     CONCAT62(local_458.d.d._2_6_,CONCAT11(local_458.d.d._1_1_,local_458.d.d._0_1_))
                     ,1,0x10);
        }
      }
      switch((pQVar14->measurement).metric) {
      case BitsPerSecond:
        qVar22 = (pQVar14->measurement).value;
        pcVar7 = "bit/s";
LAB_00121185:
        anon_unknown.dwarf_a32cc::FixedBufString<1022>::appendScaled<1000>(&local_440,qVar22,pcVar7)
        ;
        break;
      case BytesPerSecond:
        dVar2 = (pQVar14->measurement).value;
        local_458.d.d._1_1_ = 0;
        dVar21 = 1.0;
        puVar8 = &(anonymous_namespace)::multiplePrefixes;
        if (1000.0 < dVar2) {
          lVar12 = 1;
          puVar8 = &(anonymous_namespace)::multiplePrefixes;
          do {
            puVar8 = puVar8 + 1;
            lVar9 = lVar12 * 0xfa000;
            lVar12 = lVar12 << 10;
          } while ((double)lVar9 < dVar2);
          dVar21 = (double)lVar12;
        }
        local_458.d.d._0_1_ = *puVar8;
        iVar6 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,", %.3g %s%s",
                         dVar2 / dVar21,&local_458,"B/s");
        goto LAB_00121372;
      case InstructionReads:
      case Events:
      case BytesAllocated:
      case CPUMigrations:
      case BusCycles:
      case StalledCycles:
      case BranchInstructions:
      case BranchMisses:
      case CacheReferences:
      case CacheReads:
      case CacheWrites:
      case CachePrefetches:
      case CacheMisses:
      case CacheReadMisses:
      case CacheWriteMisses:
      case CachePrefetchMisses:
      case ContextSwitches:
      case PageFaults:
      case MinorPageFaults:
      case MajorPageFaults:
      case AlignmentFaults:
      case EmulationFaults:
switchD_0012115b_caseD_5:
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          qVar22 = (pQVar14->measurement).value / dVar20;
          pcVar7 = "/sec";
          goto LAB_00121185;
        }
        break;
      case CPUCycles:
      case RefCPUCycles:
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          qVar22 = (pQVar14->measurement).value / dVar20;
          pcVar7 = "Hz";
          goto LAB_00121185;
        }
        break;
      case Instructions:
        lVar12 = (results->d).size;
        bVar19 = lVar12 != 0;
        if (bVar19) {
          pQVar16 = (results->d).ptr;
          if ((pQVar16->measurement).metric != CPUCycles) {
            lVar12 = lVar12 * 0x50;
            pQVar11 = pQVar16;
            do {
              lVar12 = lVar12 + -0x50;
              bVar19 = lVar12 != 0;
              if (lVar12 == 0) goto LAB_00121342;
              pQVar16 = pQVar11 + 1;
              pQVar5 = pQVar11 + 1;
              pQVar11 = pQVar16;
            } while ((pQVar5->measurement).metric != CPUCycles);
          }
          qVar22 = (pQVar16->measurement).value;
        }
LAB_00121342:
        if (!bVar19) goto switchD_0012115b_caseD_5;
        iVar6 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,", %.3f instr/cycle",
                         (pQVar14->measurement).value / qVar22);
LAB_00121372:
        local_440.used = local_440.used + (long)iVar6;
      }
      QTest::formatResult<double>(&local_458,(pQVar14->measurement).value,iVar13);
      pcVar7 = local_458.d.ptr;
      if (local_458.d.ptr == (char *)0x0) {
        pcVar7 = (char *)&QByteArray::_empty;
      }
      iVar13 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,
                        " (total: %s, iterations: %d)\n",pcVar7,(ulong)(uint)pQVar14->iterations);
      local_440.used = local_440.used + (long)iVar13;
      piVar4 = (int *)CONCAT62(local_458.d.d._2_6_,CONCAT11(local_458.d.d._1_1_,local_458.d.d._0_1_)
                              );
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)
                     CONCAT62(local_458.d.d._2_6_,CONCAT11(local_458.d.d._1_1_,local_458.d.d._0_1_))
                     ,1,0x10);
        }
      }
      QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,msg->_M_elems);
      pQVar14 = pQVar14 + 1;
    } while (pQVar14 != pQVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTestLogger::printBenchmarkResults(const QList<QBenchmarkResult> &results)
{
    using namespace std::chrono;
    FixedBufString<1022> buf;
    auto findResultFor = [&results](QTest::QBenchmarkMetric metric) -> std::optional<qreal> {
        for (const QBenchmarkResult &result : results) {
            if (result.measurement.metric == metric)
                return result.measurement.value;
        }
        return std::nullopt;
    };

    // we need the execution time quite often, so find it first
    qreal executionTime = 0;
    if (auto ns = findResultFor(QTest::WalltimeNanoseconds))
        executionTime = *ns / (1000 * 1000 * 1000);
    else if (auto ms = findResultFor(QTest::WalltimeMilliseconds))
        executionTime = *ms / 1000;

    for (const QBenchmarkResult &result : results) {
        buf.clear();

        const char * unitText = QTest::benchmarkMetricUnit(result.measurement.metric);
        int significantDigits = QTest::countSignificantDigits(result.measurement.value);
        qreal valuePerIteration = qreal(result.measurement.value) / qreal(result.iterations);
        buf.appendf("     %s %s%s", QTest::formatResult(valuePerIteration, significantDigits).constData(),
                    unitText, result.setByMacro ? " per iteration" : "");

        switch (result.measurement.metric) {
        case QTest::BitsPerSecond:
            // for bits/s, we'll use powers of 10 (1 Mbit/s = 1000 kbit/s = 1000000 bit/s)
            buf.appendScaled<1000>(result.measurement.value, "bit/s");
            break;
        case QTest::BytesPerSecond:
            // for B/s, we'll use powers of 2 (1 MB/s = 1024 kB/s = 1048576 B/s)
            buf.appendScaled<1024>(result.measurement.value, "B/s");
            break;

        case QTest::CPUCycles:
        case QTest::RefCPUCycles:
            if (!qIsNull(executionTime))
                buf.appendScaled(result.measurement.value / executionTime, "Hz");
            break;

        case QTest::Instructions:
            if (auto cycles = findResultFor(QTest::CPUCycles)) {
                buf.appendf(", %.3f instr/cycle", result.measurement.value / *cycles);
                break;
            }
            Q_FALLTHROUGH();

        case QTest::InstructionReads:
        case QTest::Events:
        case QTest::BytesAllocated:
        case QTest::CPUMigrations:
        case QTest::BusCycles:
        case QTest::StalledCycles:
        case QTest::BranchInstructions:
        case QTest::BranchMisses:
        case QTest::CacheReferences:
        case QTest::CacheReads:
        case QTest::CacheWrites:
        case QTest::CachePrefetches:
        case QTest::CacheMisses:
        case QTest::CacheReadMisses:
        case QTest::CacheWriteMisses:
        case QTest::CachePrefetchMisses:
        case QTest::ContextSwitches:
        case QTest::PageFaults:
        case QTest::MinorPageFaults:
        case QTest::MajorPageFaults:
        case QTest::AlignmentFaults:
        case QTest::EmulationFaults:
            if (!qIsNull(executionTime))
                buf.appendScaled(result.measurement.value / executionTime, "/sec");
            break;

        case QTest::FramesPerSecond:
        case QTest::CPUTicks:
        case QTest::WalltimeMilliseconds:
        case QTest::WalltimeNanoseconds:
            break;  // no additional information
        }

        Q_ASSERT(result.iterations > 0);
        buf.appendf(" (total: %s, iterations: %d)\n",
                    QTest::formatResult(result.measurement.value, significantDigits).constData(),
                    result.iterations);

        outputMessage(buf);
    }
}